

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

int WildMidi_Init(char *config_file,unsigned_short rate,unsigned_short options)

{
  int iVar1;
  unsigned_short options_local;
  unsigned_short rate_local;
  char *config_file_local;
  
  if (WM_Initialized == 0) {
    if (config_file == (char *)0x0) {
      _WM_ERROR("WildMidi_Init",0x9fc,9,"(NULL config file pointer)",0);
      config_file_local._4_4_ = -1;
    }
    else {
      WM_InitPatches();
      iVar1 = WM_LoadConfig(config_file);
      if (iVar1 == -1) {
        config_file_local._4_4_ = -1;
      }
      else if ((options & 0x5ff8) == 0) {
        WM_MixerOptions = options;
        if (rate < 0x2b11) {
          _WM_ERROR("WildMidi_Init",0xa0e,9,"(rate out of bounds, range is 11025 - 65535)",0);
          WM_FreePatches();
          config_file_local._4_4_ = -1;
        }
        else {
          WM_Initialized = 1;
          config_file_local._4_4_ = 0;
          _WM_SampleRate = rate;
        }
      }
      else {
        _WM_ERROR("WildMidi_Init",0xa06,9,"(invalid option)",0);
        WM_FreePatches();
        config_file_local._4_4_ = -1;
      }
    }
  }
  else {
    _WM_ERROR("WildMidi_Init",0x9f7,10,(char *)0x0,0);
    config_file_local._4_4_ = -1;
  }
  return config_file_local._4_4_;
}

Assistant:

WM_SYMBOL int WildMidi_Init(const char * config_file, unsigned short int rate,
		unsigned short int options) {
	if (WM_Initialized) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_ALR_INIT, NULL, 0);
		return -1;
	}

	if (config_file == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG,
				"(NULL config file pointer)", 0);
		return -1;
	}
	WM_InitPatches();
	if (WM_LoadConfig(config_file) == -1) {
		return -1;
	}

	if (options & 0x5FF8) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(invalid option)",
				0);
		WM_FreePatches();
		return -1;
	}
	WM_MixerOptions = options;

	if (rate < 11025) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG,
				"(rate out of bounds, range is 11025 - 65535)", 0);
		WM_FreePatches();
		return -1;
	}
	_WM_SampleRate = rate;
	WM_Initialized = 1;

	return 0;
}